

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHandler.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
getString(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *__return_storage_ptr__,Document *value,string *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Ch *__s;
  MemberIterator itr;
  allocator<char> local_39;
  undefined1 local_38 [16];
  size_type local_28;
  Ch local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,(Ch *)value);
  if ((value->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.f.flags == 3) {
    if ((local_38._0_8_ ==
         (ulong)(value->
                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ).data_.s.length * 0x20 +
         ((ulong)(value->
                 super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ).data_.s.str & 0xffffffffffff)) || (*(short *)(local_38._0_8_ + 0x1e) == 0)) {
      (__return_storage_ptr__->value)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->value).field_2;
      (__return_storage_ptr__->value)._M_string_length = 0;
      (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->is_some = false;
    }
    else {
      __s = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)(local_38._0_8_ + 0x10));
      std::__cxx11::string::string<std::allocator<char>>((string *)(local_38 + 8),__s,&local_39);
      paVar1 = &(__return_storage_ptr__->value).field_2;
      (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
      if ((Ch *)local_38._8_8_ == &local_20) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_1f,local_20);
        *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_18;
      }
      else {
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_38._8_8_;
        (__return_storage_ptr__->value).field_2._M_allocated_capacity = CONCAT71(uStack_1f,local_20)
        ;
      }
      (__return_storage_ptr__->value)._M_string_length = local_28;
      __return_storage_ptr__->is_some = true;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("IsObject()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidjson/include/rapidjson/document.h"
                ,0x48c,
                "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

optional<string> getString (Document &value, const string &key) {
    auto itr = value.FindMember(key.c_str());
    if (itr == value.MemberEnd() || itr->value.IsNull()) {
        return {};
    }
    return { itr->value.GetString() };
}